

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::Session::runInternal(Session *this)

{
  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  ColourMode CVar2;
  undefined8 *puVar3;
  pointer config;
  pointer puVar4;
  size_t sVar5;
  undefined8 this_01;
  uint64_t uVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Config *pCVar11;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar12;
  undefined4 extraout_var;
  undefined8 *puVar13;
  ostream *poVar14;
  Context *pCVar15;
  undefined4 extraout_var_00;
  ReporterRegistryImpl *pRVar16;
  undefined4 extraout_var_01;
  MultiReporter *pMVar17;
  EventListenerFactory *pEVar18;
  undefined4 extraout_var_02;
  IEventListener *pIVar19;
  undefined4 extraout_var_03;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases;
  TestSpec *this_02;
  _Base_ptr p_Var20;
  long lVar21;
  TestCaseInfo **testInfo;
  pointer this_03;
  pointer pFVar22;
  size_t in_R8;
  ReporterConfig *config_00;
  unique_ptr<Catch::Config> *this_04;
  const_iterator __begin3;
  pointer pFVar23;
  unique_ptr<Catch::MultiReporter> multi;
  IEventListenerPtr reporter;
  IEventListener *local_2f8;
  undefined1 local_2f0 [16];
  ReporterConfig *local_2e0;
  Totals totals;
  undefined1 local_298 [64];
  TestGroup tests;
  undefined4 extraout_var_04;
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  if ((this->m_configData).shardCount <= (this->m_configData).shardIndex) {
    poVar14 = std::operator<<((ostream *)&std::cerr,"The shard count (");
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
    poVar14 = std::operator<<(poVar14,") must be greater than the shard index (");
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
    std::operator<<(poVar14,")\n");
    std::ostream::flush();
    return 1;
  }
  Session::config(this);
  this_04 = &this->m_config;
  pCVar11 = Detail::unique_ptr<Catch::Config>::operator*(this_04);
  seedRng(&pCVar11->super_IConfig);
  if ((this->m_configData).filenamesAsTags == true) {
    pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar8 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar12);
    puVar13 = (undefined8 *)
              (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x10))
                        ((long *)CONCAT44(extraout_var,iVar8));
    puVar3 = (undefined8 *)puVar13[1];
    for (puVar13 = (undefined8 *)*puVar13; puVar13 != puVar3; puVar13 = puVar13 + 1) {
      TestCaseInfo::addFilenameTag((TestCaseInfo *)*puVar13);
    }
  }
  pCVar15 = getCurrentMutableContext();
  pCVar11 = this_04->m_ptr;
  pCVar15->m_config = &pCVar11->super_IConfig;
  totals.assertions.passed = (uint64_t)pCVar11;
  pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar8 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
  pRVar16 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                      ((unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl> *)
                       CONCAT44(extraout_var_00,iVar8));
  local_2f0._0_8_ = this_04;
  if (((pRVar16->listeners).
       super__Vector_base<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (pRVar16->listeners).
       super__Vector_base<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (config = (pCVar11->m_processedReporterSpecs).
               super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(pCVar11->m_processedReporterSpecs).
           super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish - (long)config == 0x78)) {
    makeStream((Catch *)&multi,(string *)&config->outputFilename);
    CVar2 = config->colourMode;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_298,&(config->customOptions)._M_t);
    tests.m_reporter = &(multi.m_ptr)->super_IEventListener;
    tests.m_config = pCVar11;
    tests.m_context.super_IResultCapture._vptr_IResultCapture._0_1_ = CVar2;
    std::_Rb_tree_header::_Rb_tree_header
              ((_Rb_tree_header *)&tests.m_context.m_runInfo.name.m_size,
               (_Rb_tree_header *)(local_298 + 8));
    anon_unknown_26::createReporter((string *)&reporter,(ReporterConfig *)config);
    ReporterConfig::~ReporterConfig((ReporterConfig *)&tests);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_298);
  }
  else {
    Detail::make_unique<Catch::MultiReporter,Catch::Config_const*&>
              ((Detail *)&multi,(Config **)&totals);
    pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar8 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
    pRVar16 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                        ((unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl> *)
                         CONCAT44(extraout_var_01,iVar8));
    puVar4 = (pRVar16->listeners).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_03 = (pRVar16->listeners).
                   super__Vector_base<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_03 != puVar4;
        this_03 = this_03 + 1) {
      pMVar17 = Detail::unique_ptr<Catch::MultiReporter>::operator->(&multi);
      pEVar18 = Detail::unique_ptr<Catch::EventListenerFactory>::operator->(this_03);
      (*pEVar18->_vptr_EventListenerFactory[2])(&tests,pEVar18,totals.assertions.passed);
      MultiReporter::addListener(pMVar17,(IEventListenerPtr *)&tests);
      if (tests.m_reporter != (IEventListener *)0x0) {
        (*(tests.m_reporter)->_vptr_IEventListener[1])();
      }
    }
    local_2e0 = *(ReporterConfig **)(totals.assertions.passed + 0x120);
    for (config_00 = *(ReporterConfig **)(totals.assertions.passed + 0x118);
        reporter.m_ptr = &(multi.m_ptr)->super_IEventListener, config_00 != local_2e0;
        config_00 = (ReporterConfig *)
                    &config_00[1].m_customOptions._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left) {
      pMVar17 = Detail::unique_ptr<Catch::MultiReporter>::operator->(&multi);
      uVar6 = totals.assertions.passed;
      makeStream((Catch *)&local_2f8,
                 (string *)&(config_00->m_customOptions)._M_t._M_impl.super__Rb_tree_header);
      sVar5 = (config_00->m_customOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_298,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(config_00 + 1));
      tests.m_reporter = local_2f8;
      local_2f8 = (IEventListener *)0x0;
      tests.m_config = (Config *)uVar6;
      tests.m_context.super_IResultCapture._vptr_IResultCapture._0_1_ = (ColourMode)sVar5;
      std::_Rb_tree_header::_Rb_tree_header
                ((_Rb_tree_header *)&tests.m_context.m_runInfo.name.m_size,
                 (_Rb_tree_header *)(local_298 + 8));
      anon_unknown_26::createReporter((string *)(local_2f0 + 8),config_00);
      MultiReporter::addReporter(pMVar17,(IEventListenerPtr *)(local_2f0 + 8));
      if ((long *)local_2f0._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_2f0._8_8_ + 8))();
      }
      ReporterConfig::~ReporterConfig((ReporterConfig *)&tests);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_298);
    }
    multi.m_ptr = (MultiReporter *)0x0;
    Detail::unique_ptr<Catch::MultiReporter>::~unique_ptr(&multi);
    this_04 = (unique_ptr<Catch::Config> *)local_2f0._0_8_;
  }
  pCVar11 = Detail::unique_ptr<Catch::Config>::operator->(this_04);
  iVar8 = (*(pCVar11->super_IConfig)._vptr_IConfig[0xd])(pCVar11);
  puVar13 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar8) + 0x18);
  puVar3 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar8) + 0x20);
  if (puVar13 != puVar3) {
    iVar8 = 1;
    for (; puVar13 != puVar3; puVar13 = puVar13 + 4) {
      pIVar19 = Detail::unique_ptr<Catch::IEventListener>::operator->(&reporter);
      (*pIVar19->_vptr_IEventListener[3])(pIVar19,*puVar13,puVar13[1]);
    }
    goto LAB_0014f1cd;
  }
  pIVar19 = Detail::unique_ptr<Catch::IEventListener>::operator*(&reporter);
  pCVar11 = Detail::unique_ptr<Catch::Config>::operator*(this_04);
  bVar7 = list(pIVar19,pCVar11);
  iVar8 = 0;
  if (bVar7) goto LAB_0014f1cd;
  tests.m_config = this_04->m_ptr;
  tests.m_reporter = reporter.m_ptr;
  RunContext::RunContext(&tests.m_context,&(tests.m_config)->super_IConfig,&reporter);
  this_00 = &tests.m_tests;
  p_Var1 = &tests.m_tests._M_t._M_impl.super__Rb_tree_header;
  tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tests.m_matches.
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tests.m_matches.
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tests.m_matches.
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests.m_unmatchedTestSpecs = false;
  tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  iVar8 = (*((tests.m_config)->super_IConfig)._vptr_IConfig[0xd])();
  if (*(long *)(CONCAT44(extraout_var_03,iVar8) + 0x18) !=
      *(long *)(CONCAT44(extraout_var_03,iVar8) + 0x20)) {
    __assert_fail("m_config->testSpec().getInvalidSpecs().empty() && \"Invalid test specs should be handled before running tests\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x434,
                  "Catch::(anonymous namespace)::TestGroup::TestGroup(IEventListenerPtr &&, const Config *)"
                 );
  }
  testCases = getAllTestCasesSorted(&(tests.m_config)->super_IConfig);
  iVar8 = (*((tests.m_config)->super_IConfig)._vptr_IConfig[0xd])();
  this_02 = (TestSpec *)CONCAT44(extraout_var_04,iVar8);
  if ((this_02->m_filters).
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this_02->m_filters).
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar22 = (pointer)(testCases->
                       super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
    for (pFVar23 = (pointer)(testCases->
                            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                            )._M_impl.super__Vector_impl_data._M_start; pFVar23 != pFVar22;
        pFVar23 = (pointer)&(pFVar23->name).field_2) {
      if ((((TestCaseInfo *)(pFVar23->name)._M_dataplus._M_p)->properties & IsHidden) == None) {
        local_298._0_8_ = pFVar23;
        std::
        _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
        ::_M_emplace_unique<Catch::TestCaseHandle_const*>
                  ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                    *)this_00,(TestCaseHandle **)local_298);
      }
    }
  }
  else {
    TestSpec::matchesByFilter
              ((Matches *)local_298,this_02,testCases,&(tests.m_config)->super_IConfig);
    std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
    _M_move_assign(&tests.m_matches,
                   (vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                    *)local_298);
    std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
    ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
            local_298);
    pFVar23 = tests.m_matches.
              super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pFVar22 = tests.m_matches.
                   super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar22 != pFVar23;
        pFVar22 = pFVar22 + 1) {
      std::
      _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*const*,std::vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>>>
                ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                  *)this_00,
                 (__normal_iterator<const_Catch::TestCaseHandle_*const_*,_std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>_>
                  )(pFVar22->tests).
                   super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_Catch::TestCaseHandle_*const_*,_std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>_>
                  )(pFVar22->tests).
                   super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  uVar9 = (*((tests.m_config)->super_IConfig)._vptr_IConfig[0x12])();
  uVar10 = (*((tests.m_config)->super_IConfig)._vptr_IConfig[0x13])();
  createShard<std::set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>>
            ((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
              *)local_298,(Catch *)this_00,
             (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
              *)(ulong)uVar9,(ulong)uVar10,in_R8);
  std::
  _Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  ::operator=(&this_00->_M_t,
              (_Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
               *)local_298);
  std::
  _Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  ::~_Rb_tree((_Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
               *)local_298);
  totals.testCases.failedButOk = 0;
  totals.testCases.skipped = 0;
  totals.testCases.passed = 0;
  totals.testCases.failed = 0;
  totals.assertions.failedButOk = 0;
  totals.assertions.skipped = 0;
  totals.assertions.passed = 0;
  totals.assertions.failed = 0;
  for (p_Var20 = tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pFVar23 = tests.m_matches.
                super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      uVar6 = tests.m_context.m_totals.assertions.failed, this_01 = local_2f0._0_8_,
      pFVar22 = tests.m_matches.
                super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                ._M_impl.super__Vector_impl_data._M_start, (_Rb_tree_header *)p_Var20 != p_Var1;
      p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
    iVar8 = (*(tests.m_context.m_config)->_vptr_IConfig[9])();
    if (uVar6 < (ulong)(long)iVar8) {
      RunContext::runTest((Totals *)local_298,&tests.m_context,*(TestCaseHandle **)(p_Var20 + 1));
      Totals::operator+=(&totals,(Totals *)local_298);
    }
    else {
      (*(tests.m_reporter)->_vptr_IEventListener[0x12])
                (tests.m_reporter,**(undefined8 **)(p_Var20 + 1));
    }
  }
  for (; pFVar22 != pFVar23; pFVar22 = pFVar22 + 1) {
    if ((pFVar22->tests).
        super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pFVar22->tests).
        super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      tests.m_unmatchedTestSpecs = true;
      (*(tests.m_reporter)->_vptr_IEventListener[2])
                (tests.m_reporter,(pFVar22->name)._M_dataplus._M_p,(pFVar22->name)._M_string_length)
      ;
    }
  }
  if (tests.m_unmatchedTestSpecs == true) {
    pCVar11 = Detail::unique_ptr<Catch::Config>::operator->((unique_ptr<Catch::Config> *)this_01);
    iVar8 = (*(pCVar11->super_IConfig)._vptr_IConfig[7])(pCVar11);
    if ((char)iVar8 == '\0') goto LAB_0014f144;
    iVar8 = 3;
  }
  else {
LAB_0014f144:
    lVar21 = totals.testCases.failed + totals.testCases.passed;
    if (lVar21 + totals.testCases.failedButOk + totals.testCases.skipped == 0) {
      pCVar11 = Detail::unique_ptr<Catch::Config>::operator->((unique_ptr<Catch::Config> *)this_01);
      iVar8 = (*(pCVar11->super_IConfig)._vptr_IConfig[8])(pCVar11);
      if ((char)iVar8 == '\0') {
        iVar8 = 2;
        goto LAB_0014f1c0;
      }
      lVar21 = totals.testCases.failed + totals.testCases.passed;
    }
    if ((lVar21 + totals.testCases.failedButOk == 0) && (totals.testCases.skipped != 0)) {
      pCVar11 = Detail::unique_ptr<Catch::Config>::operator->((unique_ptr<Catch::Config> *)this_01);
      iVar8 = (*(pCVar11->super_IConfig)._vptr_IConfig[8])(pCVar11);
      if ((char)iVar8 == '\0') {
        iVar8 = 4;
        goto LAB_0014f1c0;
      }
    }
    iVar8 = 0xff;
    if ((int)totals.assertions.failed < 0xff) {
      iVar8 = (int)totals.assertions.failed;
    }
  }
LAB_0014f1c0:
  anon_unknown_26::TestGroup::~TestGroup(&tests);
LAB_0014f1cd:
  if (reporter.m_ptr != (IEventListener *)0x0) {
    (*(reporter.m_ptr)->_vptr_IEventListener[1])();
  }
  return iVar8;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        if ( m_configData.shardIndex >= m_configData.shardCount ) {
            Catch::cerr() << "The shard count (" << m_configData.shardCount
                          << ") must be greater than the shard index ("
                          << m_configData.shardIndex << ")\n"
                          << std::flush;
            return 1;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = prepareReporters(m_config.get());

            auto const& invalidSpecs = m_config->testSpec().getInvalidSpecs();
            if ( !invalidSpecs.empty() ) {
                for ( auto const& spec : invalidSpecs ) {
                    reporter->reportInvalidTestSpec( spec );
                }
                return 1;
            }


            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { CATCH_MOVE(reporter), m_config.get() };
            auto const totals = tests.execute();

            if ( tests.hadUnmatchedTestSpecs()
                && m_config->warnAboutUnmatchedTestSpecs() ) {
                return 3;
            }

            if ( totals.testCases.total() == 0
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 2;
            }

            if ( totals.testCases.total() > 0 &&
                 totals.testCases.total() == totals.testCases.skipped
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 4;
            }

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, static_cast<int>(totals.assertions.failed));
        }